

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

void deleteInstanceChildren(UA_Server *server,UA_NodeId *objectNodeId)

{
  uint uVar1;
  undefined8 *puVar2;
  size_t *psVar3;
  undefined8 *puVar4;
  int iVar5;
  long lVar6;
  UA_Byte *pUVar7;
  UA_BrowseDescription local_118;
  undefined1 local_c8 [120];
  UA_BrowseResult bRes;
  
  local_118.includeSubtypes = false;
  local_118._57_3_ = 0;
  local_118._68_4_ = 0;
  local_118.referenceTypeId.identifier.string.length = 0;
  local_118.referenceTypeId.identifier.string.data = (UA_Byte *)0x0;
  local_118.referenceTypeId.namespaceIndex = 0;
  local_118.referenceTypeId._2_2_ = 0;
  local_118.referenceTypeId.identifierType = UA_NODEIDTYPE_NUMERIC;
  local_118.nodeId.namespaceIndex = objectNodeId->namespaceIndex;
  local_118.nodeId._2_2_ = *(undefined2 *)&objectNodeId->field_0x2;
  local_118.nodeId.identifierType = objectNodeId->identifierType;
  local_118.nodeId.identifier.string.length = (objectNodeId->identifier).string.length;
  local_118.nodeId.identifier.string.data = (objectNodeId->identifier).string.data;
  local_118.browseDirection = UA_BROWSEDIRECTION_FORWARD;
  local_118._28_4_ = 0;
  local_118.nodeClassMask = 7;
  local_118.resultMask = 7;
  bRes.continuationPoint.length = 0;
  bRes.continuationPoint.data = (UA_Byte *)0x0;
  local_c8._112_8_ = (UA_String *)0x0;
  bRes.statusCode = 0;
  bRes._4_4_ = 0;
  bRes.referencesSize = 0;
  Service_Browse_single
            (server,&adminSession,(ContinuationPointEntry *)0x0,&local_118,0,
             (UA_BrowseResult *)(local_c8 + 0x70));
  if (bRes.continuationPoint.data != (UA_Byte *)0x0) {
    lVar6 = 0;
    pUVar7 = (UA_Byte *)0x0;
    do {
      iVar5 = *(int *)(bRes.referencesSize + 0x88 + lVar6);
      uVar1 = iVar5 - 1;
      if (uVar1 < 2) {
        local_c8._16_8_ = *(undefined8 *)(bRes.referencesSize + 0x30 + lVar6);
        psVar3 = (size_t *)(bRes.referencesSize + 0x20 + lVar6);
        local_c8._0_8_ = *psVar3;
        local_c8._8_8_ = psVar3[1];
        deleteNode(server,(UA_Session *)local_c8,(UA_NodeId *)0x1,SUB81(local_c8._16_8_,0));
      }
      else if (iVar5 == 4) {
        puVar2 = (undefined8 *)(bRes.referencesSize + lVar6);
        puVar4 = (undefined8 *)(bRes.referencesSize + 0x20 + lVar6);
        local_c8._56_8_ = *puVar4;
        local_c8._64_8_ = puVar4[1];
        psVar3 = (size_t *)(bRes.referencesSize + 0x30 + lVar6);
        local_c8._72_8_ = *psVar3;
        local_c8._80_8_ = psVar3[1];
        psVar3 = (size_t *)(bRes.referencesSize + 0x40 + lVar6);
        local_c8._88_8_ = *psVar3;
        local_c8._96_8_ = psVar3[1];
        local_c8._40_8_ = puVar2[2];
        local_c8._24_8_ = *puVar2;
        local_c8._32_8_ = puVar2[1];
        local_c8._16_8_ = (objectNodeId->identifier).string.data;
        local_c8._0_2_ = objectNodeId->namespaceIndex;
        local_c8._2_2_ = *(undefined2 *)&objectNodeId->field_0x2;
        local_c8._4_4_ = objectNodeId->identifierType;
        local_c8._8_8_ = (objectNodeId->identifier).string.length;
        local_c8[0x30] = 1;
        local_c8[0x68] = 1;
        deleteReference(server,(UA_Session *)local_c8,(UA_DeleteReferencesItem *)(ulong)uVar1);
      }
      pUVar7 = pUVar7 + 1;
      lVar6 = lVar6 + 0xc0;
    } while (pUVar7 < bRes.continuationPoint.data);
  }
  deleteMembers_noInit(local_c8 + 0x70,UA_TYPES + 0x98);
  return;
}

Assistant:

static void
deleteInstanceChildren(UA_Server *server, UA_NodeId *objectNodeId) {
    /* Browse for children */
    UA_BrowseDescription bDes;
    UA_BrowseDescription_init(&bDes);
    bDes.nodeId = *objectNodeId;
    bDes.browseDirection = UA_BROWSEDIRECTION_FORWARD;
    bDes.nodeClassMask = UA_NODECLASS_OBJECT | UA_NODECLASS_VARIABLE | UA_NODECLASS_METHOD;
    bDes.resultMask = UA_BROWSERESULTMASK_ISFORWARD | UA_BROWSERESULTMASK_NODECLASS | UA_BROWSERESULTMASK_REFERENCETYPEINFO;
    UA_BrowseResult bRes = UA_Server_browse(server, 0, &bDes);

    /* Delete Children */
    for(size_t i=0; i<bRes.referencesSize; ++i) {
        UA_ReferenceDescription *rd = &bRes.references[i];
        if((rd->nodeClass == UA_NODECLASS_OBJECT || rd->nodeClass == UA_NODECLASS_VARIABLE)) {
            UA_Server_deleteNode(server, rd->nodeId.nodeId, true);
        } else if (rd->nodeClass == UA_NODECLASS_METHOD) {
            UA_Server_deleteReference(server, *objectNodeId, rd->referenceTypeId,
                                      true, rd->nodeId, true);
        }
    }

    UA_BrowseResult_deleteMembers(&bRes); 
}